

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codacmp.c
# Opt level: O3

void compare_arrays_cold_1(void)

{
  FILE *__stream;
  int *piVar1;
  char *pcVar2;
  
  __stream = _stderr;
  piVar1 = coda_get_errno();
  pcVar2 = coda_errno_to_string(*piVar1);
  fprintf(__stream,"ERROR: %s\n",pcVar2);
  return;
}

Assistant:

static int compare_arrays_as_records(coda_cursor *cursor1, coda_cursor *cursor2, const char *key_expr)
{
    coda_expression *expr = NULL;
    hashtable *table1 = NULL;
    hashtable *table2 = NULL;
    char **keys1 = NULL;
    char **keys2 = NULL;
    long num_elements1;
    long num_elements2;
    long i;
    int result;

    if (coda_cursor_get_num_elements(cursor1, &num_elements1) != 0)
    {
        print_error_with_cursor(cursor1, 1);
        return -1;
    }
    if (coda_cursor_get_num_elements(cursor2, &num_elements2) != 0)
    {
        print_error_with_cursor(cursor2, 2);
        return -1;
    }

    if (coda_expression_from_string(key_expr, &expr) != 0)
    {
        fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
        return -1;
    }

    keys1 = malloc(num_elements1 * sizeof(const char *));
    if (keys1 == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       num_elements1 * sizeof(const char *), __FILE__, __LINE__);
        print_error_with_cursor(cursor1, 1);
        coda_expression_delete(expr);
        return -1;
    }
    for (i = 0; i < num_elements1; i++)
    {
        keys1[i] = NULL;
    }
    keys2 = malloc(num_elements2 * sizeof(const char *));
    if (keys2 == NULL)
    {

        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       num_elements2 * sizeof(const char *), __FILE__, __LINE__);
        print_error_with_cursor(cursor2, 2);
        coda_expression_delete(expr);
        free(keys1);
        return -1;
    }
    for (i = 0; i < num_elements2; i++)
    {
        keys2[i] = NULL;
    }
    table1 = hashtable_new(1);
    if (table1 == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not create hashtable) (%s:%u)", __FILE__,
                       __LINE__);
        print_error_with_cursor(cursor1, 1);
        coda_expression_delete(expr);
        free(keys1);
        free(keys2);
        return -1;
    }
    table2 = hashtable_new(1);
    if (table2 == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not create hashtable) (%s:%u)", __FILE__,
                       __LINE__);
        print_error_with_cursor(cursor2, 2);
        coda_expression_delete(expr);
        hashtable_delete(table1);
        free(keys1);
        free(keys2);
        return -1;
    }

    result = compare_arrays_as_records_sub(cursor1, cursor2, expr, num_elements1, num_elements2, keys1, keys2, table1,
                                           table2);

    coda_expression_delete(expr);
    hashtable_delete(table1);
    hashtable_delete(table2);
    for (i = 0; i < num_elements1; i++)
    {
        if (keys1[i] != NULL)
        {
            coda_free(keys1[i]);
        }
    }
    free(keys1);
    for (i = 0; i < num_elements2; i++)
    {
        if (keys2[i] != NULL)
        {
            coda_free(keys2[i]);
        }
    }
    free(keys2);

    return result;
}